

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::Recycler::GetAllocSize(Recycler *this,size_t size)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  
  if ((this->verifyEnabled != false) &&
     (uVar4 = size + this->verifyPad + 8, bVar3 = uVar4 <= size, size = uVar4, bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x465,"(allocSize > size)","allocSize > size");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  return size;
}

Assistant:

size_t Recycler::GetAllocSize(size_t size)
{
    size_t allocSize = size;
#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        allocSize += verifyPad + sizeof(size_t);
        Assert(allocSize > size);
    }
#endif

    return allocSize;
}